

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O0

int zt_unit_run_test(zt_unit *unit,zt_unit_suite *suite,zt_unit_test *test)

{
  int iVar1;
  char *pcVar2;
  zt_unit_test *in_RDX;
  long in_RSI;
  int offt_2;
  int offt_1;
  int offt;
  
  in_RDX->success = 0;
  printf("%*s%s:\n",4,"",in_RDX->name);
  if (*(long *)(in_RSI + 0x28) != 0) {
    (**(code **)(in_RSI + 0x28))(*(undefined8 *)(in_RSI + 0x40));
  }
  iVar1 = (**(code **)(in_RSI + 0x30))(in_RSI,in_RDX);
  if (iVar1 != 0) {
    test_passed(in_RDX);
  }
  if (*(long *)(in_RSI + 0x38) != 0) {
    (**(code **)(in_RSI + 0x38))(*(undefined8 *)(in_RSI + 0x40));
  }
  iVar1 = printf("%*s%s",6,"","assertions");
  printf("%*s: %ld\n",(ulong)(uint)(((0x1e - iVar1) / 2) * 2 + (0x1e - iVar1) % 2),"",
         in_RDX->assertions);
  if (in_RDX->exceptions != 0) {
    iVar1 = printf("%*s%s",6,"","unhandled_exceptions");
    printf("%*s: %ld\n",(ulong)(uint)(((0x1e - iVar1) / 2) * 2 + (0x1e - iVar1) % 2),"",
           in_RDX->exceptions);
  }
  iVar1 = printf("%*s%s",6,"","result");
  pcVar2 = "failure";
  if (in_RDX->success == 1) {
    pcVar2 = "success";
  }
  printf("%*s: %s\n",(ulong)(uint)(((0x1e - iVar1) / 2) * 2 + (0x1e - iVar1) % 2),"",pcVar2);
  return in_RDX->success;
}

Assistant:

int
zt_unit_run_test(struct zt_unit         * unit UNUSED,
                 struct zt_unit_suite   * suite,
                 struct zt_unit_test    * test)
{
    zt_assert(test);

    test->success = FALSE;

    yaml_dict(test->name, 4);

    if (suite->setup_fn) {
        suite->setup_fn(suite->data);
    }

    if(suite->try_fn(suite, test)) {
        test_passed(test);
    }

    if (suite->teardown_fn) {
        suite->teardown_fn(suite->data);
    }

    yaml_value("assertions", 6, "%ld", test->assertions);
    if (test->exceptions) {
        yaml_value("unhandled_exceptions", 6, "%ld", test->exceptions);
    }

    yaml_value("result", 6, "%s", test->success == TRUE ? "success" : "failure");

    return test->success;
}